

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

Generator * kratos::Const::const_gen(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  void *local_40;
  Generator *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  undefined1 local_19;
  
  if (const_generator_ == (Generator *)0x0) {
    local_40 = (void *)0x0;
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<kratos::Generator>,decltype(nullptr),char_const(&)[1]>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<kratos::Generator> *)&local_19,&local_40,(char (*) [1])0x3fad05);
    p_Var1 = p_Stack_30;
    const_generator_ = local_38;
    this = DAT_004df5c0;
    local_38 = (Generator *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    DAT_004df5c0 = p_Var1;
    if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
       p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
  }
  return const_generator_;
}

Assistant:

Generator *Const::const_gen() {
    if (!const_generator_) const_generator_ = std::make_shared<Generator>(nullptr, "");
    return const_generator_.get();
}